

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

DataModelConstructor __thiscall Rml::Context::GetDataModel(Context *this,String *name)

{
  DataModel *model_00;
  undefined8 uVar1;
  DataModel *model;
  String *name_local;
  Context *this_local;
  
  model_00 = GetDataModelPtr(this,name);
  if (model_00 == (DataModel *)0x0) {
    uVar1 = ::std::__cxx11::string::c_str();
    Log::Message(LT_ERROR,"Data model name \'%s\' could not be found.",uVar1);
    DataModelConstructor::DataModelConstructor((DataModelConstructor *)&this_local);
  }
  else {
    DataModelConstructor::DataModelConstructor((DataModelConstructor *)&this_local,model_00);
  }
  return _this_local;
}

Assistant:

DataModelConstructor Context::GetDataModel(const String& name)
{
	if (DataModel* model = GetDataModelPtr(name))
		return DataModelConstructor(model);

	Log::Message(Log::LT_ERROR, "Data model name '%s' could not be found.", name.c_str());
	return DataModelConstructor();
}